

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O0

void __thiscall wasm::Instrumenter::instrumentFuncs(Instrumenter *this)

{
  StorageKind SVar1;
  anon_class_24_3_54751894 visitor;
  anon_class_24_3_a0dd8725 visitor_00;
  bool bVar2;
  Fatal *pFVar3;
  reference this_00;
  pointer local_230;
  undefined1 local_1e8 [8];
  Name memoryName;
  Index funcIdx;
  Fatal local_1c8;
  char *local_40;
  char *command;
  Name **local_30;
  Instrumenter *local_28;
  Name *local_20;
  iterator globalIt;
  Builder builder;
  Instrumenter *this_local;
  
  Builder::Builder((Builder *)&globalIt,this->wasm);
  SVar1 = this->config->storageKind;
  if (SVar1 == InGlobals) {
    local_20 = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                                 (&this->functionGlobals);
    command = (char *)&globalIt;
    local_30 = &local_20;
    visitor.globalIt = (iterator *)local_30;
    visitor.builder = (Builder *)command;
    visitor.this = this;
    local_28 = this;
    ModuleUtils::iterDefinedFunctions<wasm::Instrumenter::instrumentFuncs()::__0>
              (this->wasm,visitor);
  }
  else if (SVar1 - InMemory < 2) {
    bVar2 = FeatureSet::hasAtomics(&this->wasm->features);
    if (!bVar2) {
      local_40 = "--in-secondary-memory";
      if (this->config->storageKind == InMemory) {
        local_40 = "--in-memory";
      }
      local_40 = local_40 + 2;
      Fatal::Fatal(&local_1c8);
      pFVar3 = Fatal::operator<<(&local_1c8,(char (*) [10])"error: --");
      pFVar3 = Fatal::operator<<(pFVar3,&local_40);
      Fatal::operator<<(pFVar3,(char (*) [32])" requires atomics to be enabled");
      Fatal::~Fatal(&local_1c8);
    }
    memoryName.super_IString.str._M_str._0_4_ = 0;
    bVar2 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::empty(&this->wasm->memories);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!wasm->memories.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-split/instrumenter.cpp"
                    ,0x8d,"void wasm::Instrumenter::instrumentFuncs()");
    }
    if (this->config->storageKind == InMemory) {
      this_00 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[](&this->wasm->memories,0);
      local_230 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                            (this_00);
    }
    else {
      local_230 = (pointer)&this->secondaryMemory;
    }
    local_1e8 = (undefined1  [8])
                (local_230->super_Importable).super_Named.name.super_IString.str._M_len;
    memoryName.super_IString.str._M_len =
         (size_t)(local_230->super_Importable).super_Named.name.super_IString.str._M_str;
    visitor_00.funcIdx = (Index *)&memoryName.super_IString.str._M_str;
    visitor_00.builder = (Builder *)&globalIt;
    visitor_00.memoryName = (Name *)local_1e8;
    ModuleUtils::iterDefinedFunctions<wasm::Instrumenter::instrumentFuncs()::__1>
              (this->wasm,visitor_00);
  }
  return;
}

Assistant:

void Instrumenter::instrumentFuncs() {
  // Inject code at the beginning of each function to advance the monotonic
  // counter and set the function's timestamp if it hasn't already been set.
  Builder builder(*wasm);
  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      // (if (i32.eqz (global.get $timestamp))
      //   (block
      //     (global.set $monotonic_counter
      //       (i32.add
      //         (global.get $monotonic_counter)
      //         (i32.const 1)
      //       )
      //     )
      //     (global.set $timestamp
      //       (global.get $monotonic_counter)
      //     )
      //   )
      // )
      auto globalIt = functionGlobals.begin();
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeIf(
            builder.makeUnary(EqZInt32,
                              builder.makeGlobalGet(*globalIt, Type::i32)),
            builder.makeSequence(
              builder.makeGlobalSet(
                counterGlobal,
                builder.makeBinary(
                  AddInt32,
                  builder.makeGlobalGet(counterGlobal, Type::i32),
                  builder.makeConst(Literal::makeOne(Type::i32)))),
              builder.makeGlobalSet(
                *globalIt, builder.makeGlobalGet(counterGlobal, Type::i32)))),
          func->body,
          func->body->type);
        ++globalIt;
      });
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      if (!wasm->features.hasAtomics()) {
        const char* command =
          config.storageKind == WasmSplitOptions::StorageKind::InMemory
            ? "in-memory"
            : "in-secondary-memory";
        Fatal() << "error: --" << command << " requires atomics to be enabled";
      }
      // (i32.atomic.store8 offset=funcidx (i32.const 0) (i32.const 1))
      Index funcIdx = 0;
      assert(!wasm->memories.empty());
      Name memoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
        func->body = builder.makeSequence(
          builder.makeAtomicStore(1,
                                  funcIdx,
                                  builder.makeConstPtr(0, Type::i32),
                                  builder.makeConst(uint32_t(1)),
                                  Type::i32,
                                  memoryName),
          func->body,
          func->body->type);
        ++funcIdx;
      });
      break;
    }
  }
}